

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dchChoice.c
# Opt level: O2

void Dch_CheckChoices(Aig_Man_t *p,int fSkipRedSupps)

{
  Aig_Obj_t *pAVar1;
  bool bVar2;
  int iVar3;
  Aig_Obj_t *pObj;
  ulong uVar4;
  char *__s;
  ulong uVar5;
  
  Aig_ManCleanMarkA(p);
  bVar2 = false;
  for (uVar5 = 0; (long)uVar5 < (long)p->vObjs->nSize; uVar5 = uVar5 + 1) {
    pObj = (Aig_Obj_t *)Vec_PtrEntry(p->vObjs,(int)uVar5);
    if ((pObj != (Aig_Obj_t *)0x0) &&
       (uVar4 = *(ulong *)&pObj->field_0x18, 0xfffffffd < ((uint)uVar4 & 7) - 7)) {
      if (p->pEquivs[uVar5] != (Aig_Obj_t *)0x0) {
        if ((uVar4 & 0x10) != 0) {
          printf("node %d participates in more than one choice class\n",uVar5 & 0xffffffff);
          uVar4 = *(ulong *)&pObj->field_0x18;
          bVar2 = true;
        }
        *(ulong *)&pObj->field_0x18 = uVar4 | 0x10;
        if (fSkipRedSupps != 0) {
          iVar3 = Dch_ObjCheckSuppRed(p,pObj,p->pEquivs[uVar5]);
          if (iVar3 != 0) {
            printf("node %d and repr %d have diff supports\n",(ulong)(uint)pObj->Id,
                   (ulong)(uint)p->pEquivs[uVar5]->Id);
          }
        }
        pObj = p->pEquivs[uVar5];
        uVar4 = *(ulong *)&pObj->field_0x18;
        if (p->pEquivs[pObj->Id] == (Aig_Obj_t *)0x0) {
          if ((uVar4 & 0x10) != 0) {
            printf("repr %d has final node %d participates in more than one choice class\n",
                   uVar5 & 0xffffffff,(ulong)(uint)pObj->Id);
            uVar4 = *(ulong *)&pObj->field_0x18;
            bVar2 = true;
          }
          uVar4 = uVar4 | 0x10;
          *(ulong *)&pObj->field_0x18 = uVar4;
        }
        if (0x3f < (uint)uVar4) {
          printf("node %d belonging to choice has fanout %d\n",(ulong)(uint)pObj->Id,
                 (ulong)((uint)uVar4 >> 6));
        }
      }
      if (((p->pReprs != (Aig_Obj_t **)0x0) &&
          (pAVar1 = p->pReprs[uVar5], pAVar1 != (Aig_Obj_t *)0x0)) &&
         (0x3f < *(uint *)&pObj->field_0x18)) {
        printf("node %d has representative %d and fanout count %d\n",(ulong)(uint)pObj->Id,
               (ulong)(uint)pAVar1->Id,(ulong)(*(uint *)&pObj->field_0x18 >> 6));
        bVar2 = true;
      }
    }
  }
  Aig_ManCleanMarkA(p);
  __s = "Verification of choice AIG FAILED.";
  if (!bVar2) {
    __s = "Verification of choice AIG succeeded.";
  }
  puts(__s);
  return;
}

Assistant:

void Dch_CheckChoices( Aig_Man_t * p, int fSkipRedSupps )
{
    Aig_Obj_t * pObj;
    int i, fProb = 0;
    Aig_ManCleanMarkA( p );
    Aig_ManForEachNode( p, pObj, i )
    {
        if ( p->pEquivs[i] != NULL )
        {
            if ( pObj->fMarkA == 1 )
                printf( "node %d participates in more than one choice class\n", i ), fProb = 1;
            pObj->fMarkA = 1;
            // check redundancy
            if ( fSkipRedSupps && Dch_ObjCheckSuppRed( p, pObj, p->pEquivs[i]) )
                printf( "node %d and repr %d have diff supports\n", pObj->Id, p->pEquivs[i]->Id );
            // consider the next one
            pObj = p->pEquivs[i];
            if ( p->pEquivs[Aig_ObjId(pObj)] == NULL )
            {
                if ( pObj->fMarkA == 1 )
                    printf( "repr %d has final node %d participates in more than one choice class\n", i, pObj->Id ), fProb = 1;
                pObj->fMarkA = 1;
            }
            // consider the non-head ones
            if ( pObj->nRefs > 0 )
                printf( "node %d belonging to choice has fanout %d\n", pObj->Id, pObj->nRefs );
        }
        if ( p->pReprs && p->pReprs[i] != NULL )
        {
            if ( pObj->nRefs > 0 )
                printf( "node %d has representative %d and fanout count %d\n", pObj->Id, p->pReprs[i]->Id, pObj->nRefs ), fProb = 1;
        }
    }
    Aig_ManCleanMarkA( p );
    if ( !fProb )
        printf( "Verification of choice AIG succeeded.\n" );
    else
        printf( "Verification of choice AIG FAILED.\n" );
}